

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_print(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  long lVar2;
  Machine *pMVar3;
  Machine *pMVar4;
  Machine *pMVar5;
  bool bVar6;
  long *plVar7;
  undefined2 *puVar8;
  _func_int **pp_Var9;
  _func_int *p_Var10;
  Machine *pMVar11;
  Interpreter *__s;
  ulong __n;
  size_t __n_00;
  anon_union_8_3_2f476f46_for_data aVar12;
  String SVar13;
  Value delimiter;
  Value s;
  Machine *local_d8;
  char local_d0;
  undefined1 local_c8 [16];
  Value local_b8;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_a8;
  anon_union_8_3_2f476f46_for_data local_a0;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_98;
  anon_union_8_3_2f476f46_for_data local_90;
  _func_int **local_88;
  anon_union_8_3_2f476f46_for_data local_80;
  Machine *local_78;
  anon_union_8_3_2f476f46_for_data local_70;
  long *local_68;
  anon_union_8_3_2f476f46_for_data local_60;
  Machine *local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  Machine *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  Context *local_38;
  
  local_60.tempNum._0_1_ = '\0';
  plVar7 = (long *)operator_new(0x30);
  plVar7[1] = 1;
  *plVar7 = (long)&PTR__StringStorage_001bf0d8;
  plVar7[3] = 2;
  plVar7[4] = -1;
  puVar8 = (undefined2 *)operator_new__(2);
  plVar7[2] = (long)puVar8;
  *puVar8 = 0x73;
  local_68 = plVar7;
  Context::GetVar((Context *)&local_b8,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  if ((local_68 != (long *)0x0) && (local_60.tempNum._0_1_ == '\0')) {
    plVar7 = local_68 + 1;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (**(code **)(*local_68 + 8))();
    }
    local_68 = (long *)0x0;
  }
  if (local_b8.type == Null) {
    Value::Value((Value *)local_c8,"null");
    Value::operator=(&local_b8,(Value *)local_c8);
    if ((Temp < local_c8[0]) && ((RefCountedStorage *)local_c8._8_8_ != (RefCountedStorage *)0x0)) {
      plVar7 = (long *)(local_c8._8_8_ + 8);
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(*(_func_int ***)local_c8._8_8_)[1])();
      }
    }
  }
  local_80.tempNum._0_1_ = '\0';
  pp_Var9 = (_func_int **)operator_new(0x30);
  pp_Var9[1] = (_func_int *)0x1;
  *pp_Var9 = (_func_int *)&PTR__StringStorage_001bf0d8;
  pp_Var9[3] = (_func_int *)0xa;
  pp_Var9[4] = (_func_int *)0xffffffffffffffff;
  p_Var10 = (_func_int *)operator_new__(10);
  pp_Var9[2] = p_Var10;
  *(undefined8 *)p_Var10 = 0x6574696d696c6564;
  *(undefined2 *)(p_Var10 + 8) = 0x72;
  local_88 = pp_Var9;
  Context::GetVar((Context *)local_c8,(String *)partialResult.rs,(LocalOnlyMode)&local_88);
  if ((local_88 != (_func_int **)0x0) && (local_80.tempNum._0_1_ == '\0')) {
    pp_Var9 = local_88 + 1;
    *pp_Var9 = *pp_Var9 + -1;
    if (*pp_Var9 == (_func_int *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    local_88 = (_func_int **)0x0;
  }
  if (local_c8[0] == Null) {
    pp_Var9 = (partialResult.rs[2].result.data.ref)->_vptr_RefCountedStorage;
    SVar13 = Value::ToString((Value *)&local_98,(Machine *)&local_b8);
    (*(code *)pp_Var9)(&local_98,0,SVar13._8_8_);
    if ((local_98 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       ((bool)local_90.tempNum._0_1_ == false)) {
      plVar7 = &(local_98->super_RefCountedStorage).refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_98->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_98 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
  }
  else {
    bVar6 = Value::operator==((Value *)local_c8,(Value *)&_EOL);
    aVar12.number = *partialResult.rs[2].result.data;
    if (bVar6) {
      SVar13 = Value::ToString((Value *)&local_a8,(Machine *)&local_b8);
      (*(code *)aVar12)(&local_a8,1,SVar13._8_8_);
      if ((local_a8 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
         ((bool)local_a0.tempNum._0_1_ == false)) {
        plVar7 = &(local_a8->super_RefCountedStorage).refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*(local_a8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_a8 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
    }
    else {
      Value::ToString((Value *)&local_78,(Machine *)&local_b8);
      Value::ToString((Value *)&local_58,(Machine *)local_c8);
      pMVar5 = local_58;
      pMVar4 = local_78;
      if (local_58 == (Machine *)0x0) {
        local_d8 = local_78;
        if (local_78 != (Machine *)0x0) {
          *(long *)&local_78->storeImplicit = *(long *)&local_78->storeImplicit + 1;
        }
      }
      else if (local_78 == (Machine *)0x0) {
        local_d8 = local_58;
        *(long *)&local_58->storeImplicit = *(long *)&local_58->storeImplicit + 1;
      }
      else {
        lVar2 = *(long *)&local_78->yielding;
        pMVar3 = *(Machine **)&local_58->yielding;
        local_40 = aVar12;
        local_38 = context;
        pMVar11 = (Machine *)operator_new(0x30);
        __n = (long)pMVar3 + lVar2 + -1;
        *(undefined8 *)&pMVar11->storeImplicit = 1;
        pMVar11->standardOutput = (TextOutputMethod)&PTR__StringStorage_001bf0d8;
        *(ulong *)&pMVar11->yielding = __n;
        (pMVar11->functionType).type = ~Null;
        (pMVar11->functionType).noInvoke = true;
        (pMVar11->functionType).localOnly = ~Off;
        *(undefined5 *)&(pMVar11->functionType).field_0x3 = 0xffffffffff;
        local_48 = pMVar3;
        __s = (Interpreter *)operator_new__(__n);
        __n_00 = lVar2 - 1;
        pMVar11->interpreter = __s;
        memset(__s,0,__n);
        memcpy(__s,pMVar4->interpreter,__n_00);
        memcpy((void *)(__n_00 + (long)__s),pMVar5->interpreter,(size_t)local_48);
        context = local_38;
        aVar12 = local_40;
        local_d8 = pMVar11;
      }
      local_d0 = '\0';
      (*(code *)aVar12)(&local_d8,0);
      if ((local_d8 != (Machine *)0x0) && (local_d0 == '\0')) {
        pbVar1 = &local_d8->storeImplicit;
        *(long *)pbVar1 = *(long *)pbVar1 + -1;
        if (*(long *)pbVar1 == 0) {
          (**(code **)(local_d8->standardOutput + 8))();
        }
        local_d8 = (Machine *)0x0;
      }
      if ((local_58 != (Machine *)0x0) && (local_50.tempNum._0_1_ == '\0')) {
        pbVar1 = &local_58->storeImplicit;
        *(long *)pbVar1 = *(long *)pbVar1 + -1;
        if (*(long *)pbVar1 == 0) {
          (**(code **)(local_58->standardOutput + 8))();
        }
      }
      if ((local_78 != (Machine *)0x0) && (local_70.tempNum._0_1_ == '\0')) {
        pbVar1 = &local_78->storeImplicit;
        *(long *)pbVar1 = *(long *)pbVar1 + -1;
        if (*(long *)pbVar1 == 0) {
          (**(code **)(local_78->standardOutput + 8))();
        }
      }
    }
  }
  IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
  pp_Var9 = IntrinsicResult::Null;
  ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = IntrinsicResult::Null;
  if (pp_Var9 != (_func_int **)0x0) {
    pp_Var9 = pp_Var9 + 1;
    *pp_Var9 = *pp_Var9 + 1;
  }
  if ((Temp < local_c8[0]) && ((RefCountedStorage *)local_c8._8_8_ != (RefCountedStorage *)0x0)) {
    plVar7 = (long *)(local_c8._8_8_ + 8);
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*(*(_func_int ***)local_c8._8_8_)[1])();
    }
  }
  if ((Temp < local_b8.type) && (local_b8.data.ref != (RefCountedStorage *)0x0)) {
    plVar7 = &(local_b8.data.ref)->refCount;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*(local_b8.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_print(Context *context, IntrinsicResult partialResult) {
		Value s = context->GetVar("s");
		if (s.IsNull()) s = "null";
		Value delimiter = context->GetVar("delimiter");
		if (delimiter.IsNull()) {
			(*context->vm->standardOutput)(s.ToString(), false);
		} else if (delimiter == _EOL) {
			(*context->vm->standardOutput)(s.ToString(), true);
		} else {
			(*context->vm->standardOutput)(s.ToString() + delimiter.ToString(), false);
		}
		return IntrinsicResult::Null;
	}